

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* kratos::create_variables
            (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,Var *var,string *name)

{
  size_type *psVar1;
  pointer *__return_storage_ptr___00;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  VarType VVar4;
  pointer pcVar5;
  pointer ppVar6;
  uint *puVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  PortPackedStruct *pPVar11;
  PackedStructFieldDef *iter;
  ulong *puVar12;
  uint *s;
  pointer ppVar13;
  uint *puVar14;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  string_view format_str_06;
  string_view format_str_07;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  undefined1 local_1e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cond;
  PortPackedStruct *p;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  slices;
  pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined1 auStack_100 [8];
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> transformed_name;
  undefined1 local_b0 [8];
  Variable v;
  string new_name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  transformed_name.field_2._8_8_ = __return_storage_ptr__;
  if (create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0') {
    create_variables();
  }
  puVar14 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((ulong)((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar14) < 5) &&
     (*puVar14 < 2)) {
    iVar9 = (*(var->super_IRNode)._vptr_IRNode[0x17])(var);
    VVar4 = var->type_;
    if ((char)iVar9 == '\0') {
      if ((VVar4 == Slice) &&
         (iVar9 = (*(var->super_IRNode)._vptr_IRNode[0x2b])(var), (char)iVar9 != '\0')) {
        new_name.field_2._8_8_ = var[1].super_IRNode._vptr_IRNode[0x14];
        (**(code **)(*(long *)var[1].super_IRNode.comment._M_dataplus._M_p + 0xf8))
                  (&v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged);
        (**(code **)(*var[1].super_IRNode._vptr_IRNode + 0xf8))(auStack_100);
        local_178.first.name._M_dataplus._M_p = (pointer)&local_178.first.name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"[].","");
        string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1e0,name,(string *)&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.first.name._M_dataplus._M_p != &local_178.first.name.field_2) {
          operator_delete(local_178.first.name._M_dataplus._M_p,
                          local_178.first.name.field_2._M_allocated_capacity + 1);
        }
        if (*(int *)new_name.field_2._8_8_ != 0) {
          __return_storage_ptr___00 =
               &names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar10 = 0;
          do {
            local_178.first.name._M_dataplus._M_p = (pointer)auStack_100;
            local_178.first.name._M_string_length = (size_type)value._M_dataplus._M_p;
            format_str_03.size_ = 0x2d;
            format_str_03.data_ = (char *)0x8;
            args_03.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_03.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_178;
            local_178.first.name.field_2._M_allocated_capacity = uVar10;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)((long)&value.field_2 + 8),(detail *)"{0}[{1}]",format_str_03,
                       args_03);
            local_178.first.name._M_dataplus._M_p = ((_Alloc_hider *)local_1e0)->_M_p;
            local_178.first.name._M_string_length = *(size_type *)((long)local_1e0 + 8);
            format_str_04.size_ = 0x2d;
            format_str_04.data_ = (char *)0x7;
            args_04.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_04.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_178;
            local_178.first.name.field_2._M_allocated_capacity = uVar10;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)&p,(detail *)0x255305,format_str_04,args_04);
            local_178.first.name._M_dataplus._M_p =
                 (pointer)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_long>._8_8_;
            local_178.first.name._M_string_length = (size_type)new_name._M_dataplus._M_p;
            format_str_05.size_ = 0x2d;
            format_str_05.data_ = (char *)0xa;
            args_05.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_05.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_178;
            local_178.first.name.field_2._M_allocated_capacity = uVar10;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)__return_storage_ptr___00,(detail *)"{0} == {1}",format_str_05,
                       args_05);
            local_b0 = (undefined1  [8])&v.name._M_string_length;
            v.name._M_dataplus._M_p = (pointer)0x0;
            v.name._M_string_length._0_1_ = 0;
            v.name.field_2._8_8_ = &v.value._M_string_length;
            v.value._M_dataplus._M_p = (pointer)0x0;
            v.value._M_string_length._0_1_ = 0;
            v.value.field_2._M_local_buf[8] = '\0';
            v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
            std::__cxx11::string::_M_assign((string *)local_b0);
            std::__cxx11::string::_M_assign((string *)(v.name.field_2._M_local_buf + 8));
            v.value.field_2._M_local_buf[8] = '\x01';
            std::
            pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<hgdb::json::Variable_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      (&local_178,(Variable *)local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr___00);
            std::
            vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
            ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                      ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                        *)transformed_name.field_2._8_8_,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.second._M_dataplus._M_p != &local_178.second.field_2) {
              operator_delete(local_178.second._M_dataplus._M_p,
                              local_178.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.first.value._M_dataplus._M_p != &local_178.first.value.field_2) {
              operator_delete(local_178.first.value._M_dataplus._M_p,
                              local_178.first.value.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.first.name._M_dataplus._M_p != &local_178.first.name.field_2) {
              operator_delete(local_178.first.name._M_dataplus._M_p,
                              local_178.first.name.field_2._M_allocated_capacity + 1);
            }
            if ((size_type *)v.name.field_2._8_8_ != &v.value._M_string_length) {
              operator_delete((void *)v.name.field_2._8_8_,
                              CONCAT71(v.value._M_string_length._1_7_,
                                       (undefined1)v.value._M_string_length) + 1);
            }
            if (local_b0 != (undefined1  [8])&v.name._M_string_length) {
              operator_delete((void *)local_b0,
                              CONCAT71(v.name._M_string_length._1_7_,
                                       (undefined1)v.name._M_string_length) + 1);
            }
            if (names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                (pointer)&cond._M_string_length) {
              operator_delete(names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              cond._M_string_length + 1);
            }
            if (p != (PortPackedStruct *)
                     &slices.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
              operator_delete(p,(ulong)((long)&((slices.
                                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish)->
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            if ((size_type *)value.field_2._8_8_ != &transformed_name._M_string_length) {
              operator_delete((void *)value.field_2._8_8_,transformed_name._M_string_length + 1);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < *(uint *)new_name.field_2._8_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0);
        if (auStack_100 != (undefined1  [8])&value._M_string_length) {
          operator_delete((void *)auStack_100,value._M_string_length + 1);
        }
        if ((size_type *)
            v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_ == &new_name._M_string_length) {
          return (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)transformed_name.field_2._8_8_;
        }
      }
      else {
        psVar2 = &v.name._M_string_length;
        v.name._M_dataplus._M_p = (pointer)0x0;
        v.name._M_string_length._0_1_ = 0;
        psVar1 = &v.value._M_string_length;
        v.value._M_dataplus._M_p = (pointer)0x0;
        v.value._M_string_length._0_1_ = 0;
        v.value.field_2._M_local_buf[8] = '\0';
        v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
        local_b0 = (undefined1  [8])psVar2;
        v.name.field_2._8_8_ = psVar1;
        (*(var->super_IRNode)._vptr_IRNode[0x1f])(&local_178,var);
        std::__cxx11::string::operator=
                  ((string *)(v.name.field_2._M_local_buf + 8),(string *)&local_178);
        paVar3 = &local_178.first.name.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.first.name._M_dataplus._M_p != paVar3) {
          operator_delete(local_178.first.name._M_dataplus._M_p,
                          local_178.first.name.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)local_b0);
        v.value.field_2._M_local_buf[8] = '\x01';
        std::
        pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<hgdb::json::Variable_&,_true>
                  (&local_178,(Variable *)local_b0,
                   &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                    empty_abi_cxx11_);
        std::
        vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
        ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                  ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                    *)transformed_name.field_2._8_8_,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.second._M_dataplus._M_p != &local_178.second.field_2) {
          operator_delete(local_178.second._M_dataplus._M_p,
                          local_178.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.first.value._M_dataplus._M_p != &local_178.first.value.field_2) {
          operator_delete(local_178.first.value._M_dataplus._M_p,
                          local_178.first.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.first.name._M_dataplus._M_p != paVar3) {
          operator_delete(local_178.first.name._M_dataplus._M_p,
                          local_178.first.name.field_2._M_allocated_capacity + 1);
        }
        if ((size_type *)v.name.field_2._8_8_ != psVar1) {
          operator_delete((void *)v.name.field_2._8_8_,
                          CONCAT71(v.value._M_string_length._1_7_,
                                   (undefined1)v.value._M_string_length) + 1);
        }
        if (local_b0 == (undefined1  [8])psVar2) {
          return (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)transformed_name.field_2._8_8_;
        }
        new_name._M_string_length =
             CONCAT71(v.name._M_string_length._1_7_,(undefined1)v.name._M_string_length);
        v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ = local_b0;
      }
      operator_delete((void *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_long>._8_8_,
                      new_name._M_string_length + 1);
    }
    else {
      if (VVar4 == Base) {
        (*(var->super_IRNode)._vptr_IRNode[0x2d])(&p,var);
        puVar12 = *(ulong **)&(p->super_Port).super_Var.super_IRNode.verilog_ln;
        new_name.field_2._8_8_ = (p->super_Port).super_Var.super_IRNode.comment._M_dataplus._M_p;
        if (puVar12 != (ulong *)new_name.field_2._8_8_) {
          do {
            local_178.first.name._M_dataplus._M_p = (name->_M_dataplus)._M_p;
            local_178.first.name._M_string_length = name->_M_string_length;
            local_178.first.name.field_2._M_allocated_capacity = *puVar12;
            local_178.first.name.field_2._8_8_ = puVar12[1];
            format_str_06.size_ = 0xdd;
            format_str_06.data_ = (char *)0x7;
            args_06.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_06.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_178;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)
                       &v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged,(detail *)0x255305,
                       format_str_06,args_06);
            local_b0 = (undefined1  [8])&v.name._M_string_length;
            v.name._M_dataplus._M_p = (pointer)0x0;
            v.name._M_string_length._0_1_ = 0;
            v.name.field_2._8_8_ = &v.value._M_string_length;
            v.value._M_dataplus._M_p = (pointer)0x0;
            v.value._M_string_length._0_1_ = 0;
            v.value.field_2._M_local_buf[8] = '\0';
            v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
            (*(var->super_IRNode)._vptr_IRNode[0x1f])((undefined1 *)((long)&value.field_2 + 8));
            local_178.first.name.field_2._M_allocated_capacity = *puVar12;
            local_178.first.name.field_2._8_8_ = puVar12[1];
            local_178.first.name._M_dataplus._M_p = (pointer)value.field_2._8_8_;
            local_178.first.name._M_string_length = (size_type)transformed_name._M_dataplus._M_p;
            format_str_07.size_ = 0xdd;
            format_str_07.data_ = (char *)0x7;
            args_07.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_07.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_178;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)auStack_100,(detail *)0x255305,format_str_07,args_07);
            std::__cxx11::string::operator=
                      ((string *)(v.name.field_2._M_local_buf + 8),(string *)auStack_100);
            if (auStack_100 != (undefined1  [8])&value._M_string_length) {
              operator_delete((void *)auStack_100,value._M_string_length + 1);
            }
            if ((size_type *)value.field_2._8_8_ != &transformed_name._M_string_length) {
              operator_delete((void *)value.field_2._8_8_,transformed_name._M_string_length + 1);
            }
            std::__cxx11::string::_M_assign((string *)local_b0);
            v.value.field_2._M_local_buf[8] = '\x01';
            std::
            pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<hgdb::json::Variable_&,_true>
                      (&local_178,(Variable *)local_b0,
                       &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                        empty_abi_cxx11_);
            std::
            vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
            ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                      ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                        *)transformed_name.field_2._8_8_,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.second._M_dataplus._M_p != &local_178.second.field_2) {
              operator_delete(local_178.second._M_dataplus._M_p,
                              local_178.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.first.value._M_dataplus._M_p != &local_178.first.value.field_2) {
              operator_delete(local_178.first.value._M_dataplus._M_p,
                              local_178.first.value.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.first.name._M_dataplus._M_p != &local_178.first.name.field_2) {
              operator_delete(local_178.first.name._M_dataplus._M_p,
                              local_178.first.name.field_2._M_allocated_capacity + 1);
            }
            if ((size_type *)v.name.field_2._8_8_ != &v.value._M_string_length) {
              operator_delete((void *)v.name.field_2._8_8_,
                              CONCAT71(v.value._M_string_length._1_7_,
                                       (undefined1)v.value._M_string_length) + 1);
            }
            if (local_b0 != (undefined1  [8])&v.name._M_string_length) {
              operator_delete((void *)local_b0,
                              CONCAT71(v.name._M_string_length._1_7_,
                                       (undefined1)v.name._M_string_length) + 1);
            }
            if ((size_type *)
                v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._8_8_ != &new_name._M_string_length) {
              operator_delete((void *)v.id.super__Optional_base<unsigned_long,_true,_true>.
                                      _M_payload.super__Optional_payload_base<unsigned_long>._8_8_,
                              new_name._M_string_length + 1);
            }
            puVar12 = puVar12 + 6;
          } while (puVar12 != (ulong *)new_name.field_2._8_8_);
        }
      }
      else {
        if (VVar4 != PortIO) {
          return (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)transformed_name.field_2._8_8_;
        }
        (*(var->super_IRNode)._vptr_IRNode[0x2e])(&p,var);
        puVar12 = *(ulong **)&(p->super_Port).super_Var.super_IRNode.verilog_ln;
        new_name.field_2._8_8_ = (p->super_Port).super_Var.super_IRNode.comment._M_dataplus._M_p;
        if (puVar12 != (ulong *)new_name.field_2._8_8_) {
          do {
            local_178.first.name._M_dataplus._M_p = (name->_M_dataplus)._M_p;
            local_178.first.name._M_string_length = name->_M_string_length;
            local_178.first.name.field_2._M_allocated_capacity = *puVar12;
            local_178.first.name.field_2._8_8_ = puVar12[1];
            format_str_01.size_ = 0xdd;
            format_str_01.data_ = (char *)0x7;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_178;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)
                       &v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged,(detail *)0x255305,
                       format_str_01,args_01);
            local_b0 = (undefined1  [8])&v.name._M_string_length;
            v.name._M_dataplus._M_p = (pointer)0x0;
            v.name._M_string_length._0_1_ = 0;
            v.name.field_2._8_8_ = &v.value._M_string_length;
            v.value._M_dataplus._M_p = (pointer)0x0;
            v.value._M_string_length._0_1_ = 0;
            v.value.field_2._M_local_buf[8] = '\0';
            v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
            (*(var->super_IRNode)._vptr_IRNode[0x1f])((undefined1 *)((long)&value.field_2 + 8));
            local_178.first.name.field_2._M_allocated_capacity = *puVar12;
            local_178.first.name.field_2._8_8_ = puVar12[1];
            local_178.first.name._M_dataplus._M_p = (pointer)value.field_2._8_8_;
            local_178.first.name._M_string_length = (size_type)transformed_name._M_dataplus._M_p;
            format_str_02.size_ = 0xdd;
            format_str_02.data_ = (char *)0x7;
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_178;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)auStack_100,(detail *)0x255305,format_str_02,args_02);
            std::__cxx11::string::operator=
                      ((string *)(v.name.field_2._M_local_buf + 8),(string *)auStack_100);
            if (auStack_100 != (undefined1  [8])&value._M_string_length) {
              operator_delete((void *)auStack_100,value._M_string_length + 1);
            }
            if ((size_type *)value.field_2._8_8_ != &transformed_name._M_string_length) {
              operator_delete((void *)value.field_2._8_8_,transformed_name._M_string_length + 1);
            }
            std::__cxx11::string::_M_assign((string *)local_b0);
            v.value.field_2._M_local_buf[8] = '\x01';
            std::
            pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<hgdb::json::Variable_&,_true>
                      (&local_178,(Variable *)local_b0,
                       &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                        empty_abi_cxx11_);
            std::
            vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
            ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                      ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                        *)transformed_name.field_2._8_8_,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.second._M_dataplus._M_p != &local_178.second.field_2) {
              operator_delete(local_178.second._M_dataplus._M_p,
                              local_178.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.first.value._M_dataplus._M_p != &local_178.first.value.field_2) {
              operator_delete(local_178.first.value._M_dataplus._M_p,
                              local_178.first.value.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.first.name._M_dataplus._M_p != &local_178.first.name.field_2) {
              operator_delete(local_178.first.name._M_dataplus._M_p,
                              local_178.first.name.field_2._M_allocated_capacity + 1);
            }
            if ((size_type *)v.name.field_2._8_8_ != &v.value._M_string_length) {
              operator_delete((void *)v.name.field_2._8_8_,
                              CONCAT71(v.value._M_string_length._1_7_,
                                       (undefined1)v.value._M_string_length) + 1);
            }
            if (local_b0 != (undefined1  [8])&v.name._M_string_length) {
              operator_delete((void *)local_b0,
                              CONCAT71(v.name._M_string_length._1_7_,
                                       (undefined1)v.name._M_string_length) + 1);
            }
            if ((size_type *)
                v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._8_8_ != &new_name._M_string_length) {
              operator_delete((void *)v.id.super__Optional_base<unsigned_long,_true,_true>.
                                      _M_payload.super__Optional_payload_base<unsigned_long>._8_8_,
                              new_name._M_string_length + 1);
            }
            puVar12 = puVar12 + 6;
          } while (puVar12 != (ulong *)new_name.field_2._8_8_);
        }
      }
      if (slices.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   slices.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    get_flatten_slices((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)&p,var);
    cond.field_2._8_8_ =
         slices.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (p != (PortPackedStruct *)
             slices.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) {
      pPVar11 = p;
      do {
        v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ = &new_name._M_string_length;
        pcVar5 = (name->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged,pcVar5,
                   pcVar5 + name->_M_string_length);
        local_b0 = (undefined1  [8])&v.name._M_string_length;
        v.name._M_dataplus._M_p = (pointer)0x0;
        v.name._M_string_length._0_1_ = 0;
        v.name.field_2._8_8_ = &v.value._M_string_length;
        v.value._M_dataplus._M_p = (pointer)0x0;
        v.value._M_string_length._0_1_ = 0;
        v.value.field_2._M_local_buf[8] = '\0';
        v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
        ppVar6 = (pPVar11->super_Port).super_Var.super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        new_name.field_2._8_8_ = pPVar11;
        for (ppVar13 = (pointer)(pPVar11->super_Port).super_Var.super_IRNode._vptr_IRNode;
            ppVar13 != ppVar6; ppVar13 = (pointer)((long)&(ppVar13->first)._M_dataplus._M_p + 4)) {
          local_178.first.name.field_2._M_allocated_capacity =
               (size_type)*(uint *)&(ppVar13->first)._M_dataplus._M_p;
          local_178.first.name._M_dataplus._M_p =
               (pointer)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._8_8_;
          local_178.first.name._M_string_length = (size_type)new_name._M_dataplus._M_p;
          format_str.size_ = 0x2d;
          format_str.data_ = (char *)0x7;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_178;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_100,(detail *)0x255305,format_str,args);
          std::__cxx11::string::operator=
                    ((string *)
                     &v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,(string *)auStack_100);
          if (auStack_100 != (undefined1  [8])&value._M_string_length) {
            operator_delete((void *)auStack_100,value._M_string_length + 1);
          }
        }
        (*(var->super_IRNode)._vptr_IRNode[0x1f])((string *)auStack_100);
        puVar7 = *(uint **)(new_name.field_2._8_8_ + 8);
        for (puVar14 = *(uint **)new_name.field_2._8_8_; puVar14 != puVar7; puVar14 = puVar14 + 1) {
          local_178.first.name.field_2._M_allocated_capacity = (size_type)*puVar14;
          local_178.first.name._M_dataplus._M_p = (pointer)auStack_100;
          local_178.first.name._M_string_length = (size_type)value._M_dataplus._M_p;
          format_str_00.size_ = 0x2d;
          format_str_00.data_ = (char *)0x8;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_178;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)(value.field_2._M_local_buf + 8),(detail *)"{0}[{1}]",format_str_00,
                     args_00);
          std::__cxx11::string::operator=
                    ((string *)auStack_100,(string *)(value.field_2._M_local_buf + 8));
          if ((size_type *)value.field_2._8_8_ != &transformed_name._M_string_length) {
            operator_delete((void *)value.field_2._8_8_,transformed_name._M_string_length + 1);
          }
        }
        std::__cxx11::string::_M_assign((string *)(v.name.field_2._M_local_buf + 8));
        std::__cxx11::string::_M_assign((string *)local_b0);
        v.value.field_2._M_local_buf[8] = '\x01';
        std::
        pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<hgdb::json::Variable_&,_true>
                  (&local_178,(Variable *)local_b0,
                   &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                    empty_abi_cxx11_);
        uVar8 = new_name.field_2._8_8_;
        std::
        vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
        ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                  ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                    *)transformed_name.field_2._8_8_,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.second._M_dataplus._M_p != &local_178.second.field_2) {
          operator_delete(local_178.second._M_dataplus._M_p,
                          local_178.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.first.value._M_dataplus._M_p != &local_178.first.value.field_2) {
          operator_delete(local_178.first.value._M_dataplus._M_p,
                          local_178.first.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.first.name._M_dataplus._M_p != &local_178.first.name.field_2) {
          operator_delete(local_178.first.name._M_dataplus._M_p,
                          local_178.first.name.field_2._M_allocated_capacity + 1);
        }
        if (auStack_100 != (undefined1  [8])&value._M_string_length) {
          operator_delete((void *)auStack_100,value._M_string_length + 1);
        }
        if ((size_type *)v.name.field_2._8_8_ != &v.value._M_string_length) {
          operator_delete((void *)v.name.field_2._8_8_,
                          CONCAT71(v.value._M_string_length._1_7_,
                                   (undefined1)v.value._M_string_length) + 1);
        }
        if (local_b0 != (undefined1  [8])&v.name._M_string_length) {
          operator_delete((void *)local_b0,
                          CONCAT71(v.name._M_string_length._1_7_,(undefined1)v.name._M_string_length
                                  ) + 1);
        }
        if ((size_type *)
            v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_ != &new_name._M_string_length) {
          operator_delete((void *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_long>._8_8_,
                          new_name._M_string_length + 1);
        }
        pPVar11 = (PortPackedStruct *)(uVar8 + 0x18);
      } while (pPVar11 != (PortPackedStruct *)cond.field_2._8_8_);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&p);
  }
  return (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)transformed_name.field_2._8_8_;
}

Assistant:

std::vector<VarCondition> create_variables(const Var *var, const std::string &name) {
    std::vector<VarCondition> result;
    const static std::string empty;
    if (var->size().size() > 1 || var->size().front() > 1) {
        // it's an array. need to flatten it
        auto slices = get_flatten_slices(var);
        for (auto const &slice : slices) {
            std::string new_name = name;
            hgdb::json::Variable v;
            for (auto const &s : slice) new_name = ::format("{0}.{1}", new_name, s);
            std::string value = var->to_string();
            for (auto const &s : slice) value = ::format("{0}[{1}]", value, s);
            v.value = value;
            v.name = new_name;
            v.rtl = true;
            result.emplace_back(std::make_pair(v, empty));
        }
    } else if (var->is_struct()) {
        // it's a packed array
        if (var->type() == VarType::PortIO) {
            auto const *p = reinterpret_cast<const PortPackedStruct *>(var);
            auto const &def = p->packed_struct();
            for (auto const &iter : def->attributes) {
                auto const &attr_name = iter.name;
                // we need to store lots of them
                std::string new_name = ::format("{0}.{1}", name, attr_name);
                hgdb::json::Variable v;
                v.value = ::format("{0}.{1}", var->to_string(), attr_name);
                v.name = new_name;
                v.rtl = true;
                result.emplace_back(std::make_pair(v, empty));
            }
        } else if (var->type() == VarType::Base) {
            auto const *p = reinterpret_cast<const VarPackedStruct *>(var);
            auto const &def = p->packed_struct();
            for (auto const &iter : def->attributes) {
                auto const &attr_name = iter.name;
                // we need to store lots of them
                std::string new_name = ::format("{0}.{1}", name, attr_name);
                hgdb::json::Variable v;
                v.value = ::format("{0}.{1}", var->to_string(), attr_name);
                v.name = new_name;
                v.rtl = true;
                result.emplace_back(std::make_pair(v, empty));
            }
        }
    } else if (var->type() == VarType::Slice &&
               reinterpret_cast<const VarSlice *>(var)->sliced_by_var()) {
        auto const *var_var_slice = reinterpret_cast<const VarVarSlice *>(var);
        // for now, we flatten out the access and only one-level of slicing
        auto const &size = var_var_slice->parent_var->size().front();
        auto select_name = var_var_slice->sliced_var()->to_string();
        auto base_name = var_var_slice->parent_var->to_string();
        // need to get the actual name. notice that we might get to_string() name,
        // in this case it might be wrong
        auto names = string::get_tokens(name, "[].");
        auto const &new_name = names[0];
        for (auto i = 0u; i < size; i++) {
            auto transformed_name = fmt::format("{0}[{1}]", base_name, i);
            auto new_name_transformed = fmt::format("{0}.{1}", new_name, i);
            auto cond = fmt::format("{0} == {1}", select_name, i);
            // the usage is setting var[10] as a watch point
            hgdb::json::Variable v;
            v.name = new_name_transformed;
            v.value = transformed_name;
            v.rtl = true;
            result.emplace_back(std::make_pair(v, cond));
        }
    } else {
        // the normal one
        hgdb::json::Variable v;
        v.value = var->to_string();
        v.name = name;
        v.rtl = true;
        result.emplace_back(std::make_pair(v, empty));
    }
    return result;
}